

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntSelectSortCost(int *pArray,int nSize,Vec_Int_t *vCosts)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int t;
  int best_i;
  int j;
  int i;
  Vec_Int_t *vCosts_local;
  int nSize_local;
  int *pArray_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    local_2c = best_i;
    t = best_i;
    while (t = t + 1, t < nSize) {
      iVar1 = Vec_IntEntry(vCosts,pArray[t]);
      iVar2 = Vec_IntEntry(vCosts,pArray[local_2c]);
      if (iVar1 < iVar2) {
        local_2c = t;
      }
    }
    iVar1 = pArray[best_i];
    pArray[best_i] = pArray[local_2c];
    pArray[local_2c] = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSortCost( int * pArray, int nSize, Vec_Int_t * vCosts )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Vec_IntEntry(vCosts, pArray[j]) < Vec_IntEntry(vCosts, pArray[best_i]) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}